

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

int uECC_compute_public_key(uint8_t *private_key,uint8_t *public_key,uECC_Curve curve)

{
  cmpresult_t cVar1;
  uECC_word_t uVar2;
  uECC_word_t local_88;
  uECC_word_t _public [8];
  uECC_word_t _private [4];
  uECC_Curve curve_local;
  uint8_t *public_key_local;
  uint8_t *private_key_local;
  
  uECC_vli_bytesToNative(_public + 7,private_key,(curve->num_n_bits + 7) / 8);
  uVar2 = uECC_vli_isZero(_public + 7,(wordcount_t)((curve->num_n_bits + 0x3f) / 0x40));
  if (uVar2 == 0) {
    cVar1 = uECC_vli_cmp(curve->n,_public + 7,(wordcount_t)((curve->num_n_bits + 0x3f) / 0x40));
    if (cVar1 == '\x01') {
      uVar2 = EccPoint_compute_public_key(&local_88,_public + 7,curve);
      if (uVar2 == 0) {
        private_key_local._4_4_ = 0;
      }
      else {
        uECC_vli_nativeToBytes(public_key,(int)curve->num_bytes,&local_88);
        uECC_vli_nativeToBytes
                  (public_key + (int)curve->num_bytes,(int)curve->num_bytes,
                   _public + (long)(int)curve->num_words + -1);
        private_key_local._4_4_ = 1;
      }
    }
    else {
      private_key_local._4_4_ = 0;
    }
  }
  else {
    private_key_local._4_4_ = 0;
  }
  return private_key_local._4_4_;
}

Assistant:

int uECC_compute_public_key(const uint8_t *private_key, uint8_t *public_key, uECC_Curve curve) {
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    uECC_word_t *_private = (uECC_word_t *)private_key;
    uECC_word_t *_public = (uECC_word_t *)public_key;
#else
    uECC_word_t _private[uECC_MAX_WORDS];
    uECC_word_t _public[uECC_MAX_WORDS * 2];
#endif

#if uECC_VLI_NATIVE_LITTLE_ENDIAN == 0
    uECC_vli_bytesToNative(_private, private_key, BITS_TO_BYTES(curve->num_n_bits));
#endif

    /* Make sure the private key is in the range [1, n-1]. */
    if (uECC_vli_isZero(_private, BITS_TO_WORDS(curve->num_n_bits))) {
        return 0;
    }

    if (uECC_vli_cmp(curve->n, _private, BITS_TO_WORDS(curve->num_n_bits)) != 1) {
        return 0;
    }

    /* Compute public key. */
    if (!EccPoint_compute_public_key(_public, _private, curve)) {
        return 0;
    }

#if uECC_VLI_NATIVE_LITTLE_ENDIAN == 0
    uECC_vli_nativeToBytes(public_key, curve->num_bytes, _public);
    uECC_vli_nativeToBytes(
        public_key + curve->num_bytes, curve->num_bytes, _public + curve->num_words);
#endif
    return 1;
}